

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O2

void __thiscall AActor::Thrust(AActor *this,double speed)

{
  Angle *this_00;
  double dVar1;
  
  this_00 = &(this->Angles).Yaw;
  dVar1 = TAngle<double>::Cos(this_00);
  (this->Vel).X = dVar1 * speed + (this->Vel).X;
  dVar1 = TAngle<double>::Sin(this_00);
  (this->Vel).Y = dVar1 * speed + (this->Vel).Y;
  return;
}

Assistant:

void Thrust(double speed)
	{
		Vel.X += speed * Angles.Yaw.Cos();
		Vel.Y += speed * Angles.Yaw.Sin();
	}